

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O1

void __thiscall TCPConnection::StoreRxData(TCPConnection *this,DataBuffer *buffer)

{
  uint8_t uVar1;
  ushort uVar2;
  ulong uVar3;
  ushort uVar4;
  uint16_t uVar5;
  
  uVar2 = this->CurrentWindow;
  if (uVar2 < buffer->Length) {
    printf("Rx window overrun, buffer %d, window %d\n",(ulong)buffer->Length);
    return;
  }
  uVar4 = buffer->Length;
  if (uVar4 != 0) {
    uVar5 = this->RxInOffset;
    uVar3 = 0;
    do {
      uVar1 = buffer->Packet[uVar3];
      uVar4 = uVar5 + 1;
      this->RxInOffset = uVar4;
      this->RxBuffer[uVar5] = uVar1;
      uVar5 = uVar4;
      if (0xff < uVar4) {
        this->RxInOffset = 0;
        uVar5 = 0;
      }
      uVar3 = uVar3 + 1;
      uVar4 = buffer->Length;
    } while (uVar3 < uVar4);
  }
  this->CurrentWindow = uVar2 - uVar4;
  this->RxBufferEmpty = false;
  return;
}

Assistant:

void TCPConnection::StoreRxData(DataBuffer* buffer)
{
    uint16_t i;

    if (buffer->Length > CurrentWindow)
    {
        printf("Rx window overrun, buffer %d, window %d\n", buffer->Length, CurrentWindow);
        return;
    }

    for (i = 0; i < buffer->Length; i++)
    {
        RxBuffer[RxInOffset++] = buffer->Packet[i];
        if (RxInOffset >= TCP_RX_WINDOW_SIZE)
        {
            RxInOffset = 0;
        }
    }
    CurrentWindow -= buffer->Length;
    RxBufferEmpty = false;
}